

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O3

void __thiscall
Js::SharedArrayBuffer::SharedArrayBuffer
          (SharedArrayBuffer *this,SharedContents *contents,DynamicType *type)

{
  long *plVar1;
  long lVar2;
  
  DynamicObject::DynamicObject((DynamicObject *)this,type,true);
  (this->super_ArrayBufferBase).isDetached = false;
  (this->super_ArrayBufferBase).externalized = false;
  (this->super_ArrayBufferBase).infoBits = '\0';
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01535958;
  this->sharedContents = (Type)0x0;
  if ((contents != (SharedContents *)0x0) && (-1 < (int)contents->bufferLength)) {
    LOCK();
    plVar1 = &contents->refCount;
    lVar2 = *plVar1;
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    if (1 < lVar2 + 1) {
      this->sharedContents = contents;
      SharedContents::AddAgent
                (contents,(DWORD_PTR)
                          (((((this->super_ArrayBufferBase).super_DynamicObject.
                              super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                          super_JavascriptLibraryBase).scriptContext.ptr);
      return;
    }
    Throw::FatalInternalError(-0x7fffbffb);
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.type.ptr)
               ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ec37
             ,(PCWSTR)0x0);
}

Assistant:

SharedArrayBuffer::SharedArrayBuffer(SharedContents * contents, DynamicType * type) :
        ArrayBufferBase(type), sharedContents(nullptr)
    {
        if (contents == nullptr || contents->bufferLength > MaxSharedArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }

        if (contents->AddRef() > 1)
        {
            sharedContents = contents;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }
#if DBG
        sharedContents->AddAgent((DWORD_PTR)GetScriptContext());
#endif
    }